

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O2

void __thiscall
toml::
result<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::__cxx11::string>
::
result<std::pair<long,toml::detail::region<std::vector<char,std::allocator<char>>>>,std::__cxx11::string>
          (result<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::__cxx11::string>
           *this,result<std::pair<long,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *other)

{
  result<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::__cxx11::string>
  rVar1;
  
  rVar1 = (result<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::__cxx11::string>
           )other->is_ok_;
  *this = rVar1;
  if (rVar1 == (result<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::__cxx11::string>
                )0x1) {
    success<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>::
    success<std::pair<long,toml::detail::region<std::vector<char,std::allocator<char>>>>>
              ((success<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>> *)
               (this + 8),&(other->field_1).succ.value);
    return;
  }
  std::__cxx11::string::string((string *)(this + 8),(string *)&(other->field_1).succ);
  return;
}

Assistant:

bool is_ok()  const noexcept {return is_ok_;}